

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParsingTests.cpp
# Opt level: O2

void testScopedName(string_view text)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  SourceManager *sourceManager;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  ReusableStringStream local_d8;
  AssertionHandler catchAssertionHandler;
  string local_80;
  undefined1 local_60 [32];
  size_type local_40;
  string *local_38;
  string_view text_local;
  
  text_local._M_str = text._M_str;
  text_local._M_len = text._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&catchAssertionHandler,&text_local,(allocator<char> *)local_60);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         parseExpression((string *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&catchAssertionHandler);
  local_60._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
  ;
  local_60._8_8_ = 0xdb;
  capturedExpression.m_size = 0x23;
  capturedExpression.m_start = "expr.kind == SyntaxKind::ScopedName";
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_60,capturedExpression,Normal);
  local_38 = &local_80;
  local_80._M_dataplus._M_p._0_4_ = 0x1a1;
  local_60[9] = *(SyntaxKind *)&(this->_M_dataplus)._M_p == ScopedName;
  local_60[8] = true;
  local_60._0_8_ = &PTR_streamReconstructedExpression_00b653c8;
  local_60._24_8_ = (long)"!==" + 1;
  local_40 = 2;
  local_60._16_8_ = this;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_60);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_60._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
  ;
  local_60._8_8_ = 0xdc;
  capturedExpression_00.m_size = 0x17;
  capturedExpression_00.m_start = "expr.toString() == text";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_60,capturedExpression_00,
             ContinueOnFailure);
  slang::syntax::SyntaxNode::toString_abi_cxx11_(&local_80,(SyntaxNode *)this);
  local_d8.m_index = (size_t)&local_80;
  Catch::operator==((enable_if_t<Detail::conjunction<Detail::is_eq_comparable<const_basic_string<char,_char_traits<char>,_allocator<char>_>_&,_basic_string_view<char,_char_traits<char>_>_&>,_Detail::negation<capture_by_value<Detail::RemoveCVRef_t<basic_string_view<char,_char_traits<char>_>_&>_>_>_>::value,_BinaryExpr<const_basic_string<char,_char_traits<char>,_allocator<char>_>_&,_basic_string_view<char,_char_traits<char>_>_&>_>
                     *)local_60,
                    (ExprLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                     *)&local_d8,&text_local);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_60);
  std::__cxx11::string::~string((string *)&local_80);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  sourceManager = getSourceManager();
  slang::Diagnostics::sort((Diagnostics *)&slang::diagnostics,sourceManager);
  if (DAT_00b8c868 != 0) {
    local_60._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
    ;
    local_60._8_8_ = 0xdd;
    macroName_01.m_size = 10;
    macroName_01.m_start = "FAIL_CHECK";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_60,
               (StringRef)ZEXT816(0x88e35c),ContinueOnFailure);
    local_d8.m_index = 0;
    local_d8.m_oss = (ostream *)0x0;
    Catch::ReusableStringStream::ReusableStringStream(&local_d8);
    reportGlobalDiags_abi_cxx11_();
    std::operator<<(local_d8.m_oss,(string *)&local_80);
    Catch::ReusableStringStream::str_abi_cxx11_((string *)local_60,&local_d8);
    Catch::AssertionHandler::handleMessage
              (&catchAssertionHandler,ExplicitFailure,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)&local_80);
    Catch::ReusableStringStream::~ReusableStringStream(&local_d8);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  return;
}

Assistant:

void testScopedName(std::string_view text) {
    auto& expr = parseExpression(std::string(text));

    REQUIRE(expr.kind == SyntaxKind::ScopedName);
    CHECK(expr.toString() == text);
    CHECK_DIAGNOSTICS_EMPTY;
}